

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

char IsDelimiter(int c)

{
  ushort **ppuVar1;
  bool bVar2;
  
  ppuVar1 = __ctype_b_loc();
  bVar2 = true;
  if ((((*ppuVar1)[c] >> 0xd & 1) == 0) &&
     ((0x2a < c + 1U || ((0x60800000001U >> ((ulong)(c + 1U) & 0x3f) & 1) == 0)))) {
    bVar2 = c == 0x3b;
  }
  return bVar2;
}

Assistant:

static char
IsDelimiter(int c)
{
    return isspace(c) ||
           c == EOF ||
           c == '(' ||
           c == ')' ||
           c == '"' ||
           c == ';';
}